

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_173::ConstantFieldPropagation::run(ConstantFieldPropagation *this,Module *module)

{
  __node_base_ptr *pp_Var1;
  Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
  *this_00;
  BoolFunctionStructValuesMap **combinedInfos_00;
  pointer puVar2;
  PassRunner *pPVar3;
  pointer puVar4;
  Global *pGVar5;
  pointer puVar6;
  ElementSegment *pEVar7;
  pointer ppEVar8;
  pointer puVar9;
  DataSegment *pDVar10;
  pointer pBVar11;
  pointer pPVar12;
  pointer pPVar13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
  *p_Var14;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>,_false>_>_>
  *p_Var15;
  bool bVar16;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
  *this_01;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>,_false>_>_>
  *this_02;
  StructValues<wasm::(anonymous_namespace)::Bool> *pSVar17;
  ulong uVar18;
  long lVar19;
  StructValues<wasm::PossibleConstantValues> *pSVar20;
  char *__function;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar21;
  pointer puVar22;
  ulong uVar23;
  __node_ptr __n;
  uint uVar24;
  long *plVar25;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar26;
  pointer ppEVar27;
  size_type *psVar28;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar29;
  undefined8 *puVar30;
  undefined1 local_5b0 [8];
  PCVScanner scanner;
  PCVStructValuesMap combinedInfos;
  PCVFunctionStructValuesMap functionSetInfos;
  __alloc_node_gen_t __alloc_node_gen;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3a8 [3];
  void *local_2f0;
  undefined8 uStack_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  BoolFunctionStructValuesMap **local_2c8;
  __node_base_ptr *local_2c0;
  __node_base_ptr *local_2b8;
  undefined1 local_2b0;
  undefined1 local_2af;
  undefined1 local_2a8 [8];
  PCVFunctionStructValuesMap functionNewInfos;
  PCVStructValuesMap rawNewInfos;
  SubTypes subTypes;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> boolPropagator;
  TypeHierarchyPropagator<wasm::PossibleConstantValues> propagator;
  PCVStructValuesMap combinedSetInfos;
  PCVStructValuesMap combinedNewInfos;
  BoolFunctionStructValuesMap functionCopyInfos;
  BoolStructValuesMap combinedCopyInfos;
  
  if (((module->features).features & 0x400) != 0) {
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_2a8,module);
    pp_Var1 = &combinedInfos.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
               ._M_h._M_single_bucket;
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)pp_Var1,module);
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_single_bucket =
         (__node_base_ptr)
         &functionCopyInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
          ._M_h._M_rehash_policy._M_next_resize;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x1;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_bucket_count = 0;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_element_count._0_4_ = 0x3f800000;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    puVar26 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar26 != puVar2) {
      do {
        functionSetInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
        ._M_h._M_single_bucket =
             (__node_base_ptr)
             (puVar26->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        std::
        unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
        ::operator[]((unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                      *)&combinedNewInfos.
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                         ._M_h._M_single_bucket,
                     (key_type *)
                     &functionSetInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                      ._M_h._M_single_bucket);
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar2);
    }
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass.runner =
         (PassRunner *)
         &scanner.
          super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
          .
          super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
          .super_Pass.name._M_string_length;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass.name._M_string_length._0_1_ = 0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .replacep = (Expression **)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .currFunction = (Function *)0x0;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .currModule = (Module *)local_2a8;
    local_5b0 = (undefined1  [8])&PTR__WalkerPass_01091a90;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    functionSetGetInfos =
         (FunctionStructValuesMap<wasm::PossibleConstantValues> *)
         &combinedNewInfos.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
          ._M_h._M_single_bucket;
    pPVar3 = (this->super_Pass).runner;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)pPVar3;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    functionNewInfos = (FunctionStructValuesMap<wasm::PossibleConstantValues> *)pp_Var1;
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           *)local_5b0,module);
    if ((PassRunner *)
        scanner.
        super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
        super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
        .super_Pass._vptr_Pass != pPVar3 &&
        scanner.
        super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
        super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
        .super_Pass._vptr_Pass != (_func_int **)0x0) {
      __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                    ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
    }
    this_00 = (Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               *)((long)&scanner.
                         super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                         .
                         super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                         .super_Pass.passArg.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload + 0x20);
    puVar4 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)pPVar3;
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .currFunction = (Function *)module;
    for (puVar21 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4;
        puVar21 = puVar21 + 1) {
      pGVar5 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar5->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::walk(this_00,&pGVar5->init);
      }
    }
    puVar29 = (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (module->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar29 != puVar6) {
      do {
        pEVar7 = (puVar29->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar7->offset != (Expression *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
          ::walk(this_00,&pEVar7->offset);
        }
        pEVar7 = (puVar29->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar8 = *(pointer *)
                   ((long)&(pEVar7->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   + 8);
        for (ppEVar27 = *(pointer *)
                         &(pEVar7->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar27 != ppEVar8; ppEVar27 = ppEVar27 + 1) {
          functionSetInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
          ._M_h._M_single_bucket = (__node_base_ptr)*ppEVar27;
          Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
          ::walk(this_00,(Expression **)
                         &functionSetInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                          ._M_h._M_single_bucket);
        }
        puVar29 = puVar29 + 1;
      } while (puVar29 != puVar6);
    }
    puVar9 = (module->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar22 = (module->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar9;
        puVar22 = puVar22 + 1) {
      pDVar10 = (puVar22->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar10->offset != (Expression *)0x0) {
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::walk(this_00,&pDVar10->offset);
      }
    }
    scanner.
    super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
    super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    .
    super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .
    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    .currFunction = (Function *)0x0;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_single_bucket =
         (__node_base_ptr)
         &combinedNewInfos.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
          ._M_h._M_rehash_policy._M_next_resize;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x1;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_bucket_count = 0;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_element_count._0_4_ = 0x3f800000;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    combinedNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
         (__node_base_ptr)
         &combinedSetInfos.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
          ._M_h._M_rehash_policy._M_next_resize;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x1;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_bucket_count = 0;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_element_count._0_4_ = 0x3f800000;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    combinedSetInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    if (functionNewInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
        ._M_h._M_bucket_count != 0) {
      plVar25 = (long *)functionNewInfos.
                        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                        ._M_h._M_bucket_count;
      do {
        StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
                  ((StructValuesMap<wasm::PossibleConstantValues> *)(plVar25 + 2),
                   (StructValuesMap<wasm::PossibleConstantValues> *)
                   &combinedSetInfos.
                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                    ._M_h._M_single_bucket);
        plVar25 = (long *)*plVar25;
      } while (plVar25 != (long *)0x0);
    }
    if (functionSetInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
        ._M_h._M_bucket_count != 0) {
      plVar25 = (long *)functionSetInfos.
                        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                        ._M_h._M_bucket_count;
      do {
        StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
                  ((StructValuesMap<wasm::PossibleConstantValues> *)(plVar25 + 2),
                   (StructValuesMap<wasm::PossibleConstantValues> *)
                   &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
        plVar25 = (long *)*plVar25;
      } while (plVar25 != (long *)0x0);
    }
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_single_bucket =
         (__node_base_ptr)
         &combinedCopyInfos.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
          ._M_h._M_rehash_policy._M_next_resize;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x1;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_bucket_count = 0;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_element_count._0_4_ = 0x3f800000;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    if (functionCopyInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
        ._M_h._M_bucket_count != 0) {
      plVar25 = (long *)functionCopyInfos.
                        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                        ._M_h._M_bucket_count;
      do {
        for (puVar30 = (undefined8 *)plVar25[4]; puVar30 != (undefined8 *)0x0;
            puVar30 = (undefined8 *)*puVar30) {
          if (puVar30[3] != puVar30[2]) {
            uVar24 = 1;
            uVar23 = 0;
            do {
              pSVar17 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>::operator[]
                                  ((StructValuesMap<wasm::(anonymous_namespace)::Bool> *)
                                   &functionCopyInfos.
                                    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                                    ._M_h._M_single_bucket,(HeapType)puVar30[1]);
              pBVar11 = (pSVar17->
                        super_vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                        ).
                        super__Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pSVar17->
                                super_vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                                ).
                                super__Vector_base<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11) <=
                  uVar23) {
                __function = 
                "T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::Bool>::operator[](size_t) [T = wasm::(anonymous namespace)::Bool]"
                ;
                goto LAB_0081c189;
              }
              uVar18 = puVar30[3] - puVar30[2];
              if (uVar18 <= uVar23) {
                __assert_fail("index < this->size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                              ,0x2c,
                              "const T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::Bool>::operator[](size_t) const [T = wasm::(anonymous namespace)::Bool]"
                             );
              }
              pBVar11 = pBVar11 + uVar23;
              pBVar11->value = (bool)(pBVar11->value | *(byte *)(puVar30[2] + uVar23));
              uVar23 = (ulong)uVar24;
              uVar24 = uVar24 + 1;
            } while (uVar23 < uVar18);
          }
        }
        plVar25 = (long *)*plVar25;
      } while (plVar25 != (long *)0x0);
    }
    SubTypes::SubTypes((SubTypes *)
                       &rawNewInfos.
                        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                        ._M_h._M_single_bucket,module);
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_single_bucket =
         (__node_base_ptr)
         &rawNewInfos.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
          ._M_h._M_rehash_policy._M_next_resize;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x1;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_bucket_count = 0;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_element_count._0_4_ = 0x3f800000;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    rawNewInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    if (this->refTest == true) {
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&functionNewInfos.
                     super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                     ._M_h._M_single_bucket,
                 (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&combinedSetInfos.
                     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                     ._M_h._M_single_bucket);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &rawNewInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    functionSetInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_single_bucket =
         (__node_base_ptr)
         &boolPropagator.subTypes.types.
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    boolPropagator.subTypes.types.
    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    boolPropagator.subTypes.typeSubTypes._M_h._M_buckets = subTypes.typeSubTypes._M_h._M_buckets;
    boolPropagator.subTypes.typeSubTypes._M_h._M_bucket_count = 0;
    boolPropagator.subTypes.typeSubTypes._M_h._M_before_begin =
         subTypes.typeSubTypes._M_h._M_before_begin;
    boolPropagator.subTypes.typeSubTypes._M_h._M_element_count =
         subTypes.typeSubTypes._M_h._M_element_count;
    boolPropagator.subTypes.typeSubTypes._M_h._M_rehash_policy._M_max_load_factor =
         subTypes.typeSubTypes._M_h._M_rehash_policy._M_max_load_factor;
    boolPropagator.subTypes.typeSubTypes._M_h._M_rehash_policy._4_4_ =
         subTypes.typeSubTypes._M_h._M_rehash_policy._4_4_;
    boolPropagator.subTypes.typeSubTypes._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,true>>>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)functionSetInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                  ._M_h._M_single_bucket,
               (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&subTypes.types.
                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>_>_>
                *)&functionSetInfos.
                   super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                   ._M_h._M_single_bucket);
    functionSetInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_initialize_map
              ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,0);
    psVar28 = &combinedCopyInfos.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               ._M_h._M_bucket_count;
    local_3a8[0]._M_buckets = &local_3a8[0]._M_single_bucket;
    local_3a8[0]._M_bucket_count = 1;
    local_3a8[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_3a8[0]._M_element_count = 0;
    local_3a8[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_3a8[0]._M_rehash_policy._M_next_resize = 0;
    local_3a8[0]._M_single_bucket = (__node_base_ptr)0x0;
    while (psVar28 = (size_type *)*psVar28, psVar28 != (size_type *)0x0) {
      UniqueDeferredQueue<wasm::HeapType>::push
                ((UniqueDeferredQueue<wasm::HeapType> *)
                 &functionSetInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                  ._M_h._M_single_bucket,(HeapType)((__node_base *)(psVar28 + 1))->_M_nxt);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_3a8);
    std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Deque_base
              ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    if (combinedCopyInfos.
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
        ._M_h._M_bucket_count != 0) {
      plVar25 = (long *)combinedCopyInfos.
                        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                        ._M_h._M_bucket_count;
      do {
        lVar19 = plVar25[2];
        if (plVar25[3] != lVar19) {
          uVar23 = 0;
          uVar18 = 1;
          do {
            if (*(char *)(lVar19 + uVar23) == '\x01') {
              pSVar20 = StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[]
                                  ((StructValuesMap<wasm::PossibleConstantValues> *)
                                   &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                                   (HeapType)plVar25[1]);
              pPVar12 = (pSVar20->
                        super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                        ).
                        super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pSVar20->
                                super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                                ).
                                super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12 >> 5) <=
                  uVar23) {
LAB_0081c1b2:
                __function = 
                "T &wasm::StructUtils::StructValues<wasm::PossibleConstantValues>::operator[](size_t) [T = wasm::PossibleConstantValues]"
                ;
LAB_0081c189:
                __assert_fail("index < this->size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                              ,0x27,__function);
              }
              pSVar20 = StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[]
                                  ((StructValuesMap<wasm::PossibleConstantValues> *)
                                   &combinedSetInfos.
                                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                                    ._M_h._M_single_bucket,(HeapType)plVar25[1]);
              pPVar13 = (pSVar20->
                        super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                        ).
                        super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pSVar20->
                                super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                                ).
                                super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar13 >> 5) <=
                  uVar23) goto LAB_0081c1b2;
              PossibleConstantValues::combine(pPVar12 + uVar23,pPVar13 + uVar23);
            }
            lVar19 = plVar25[2];
            bVar16 = uVar18 < (ulong)(plVar25[3] - lVar19);
            uVar23 = uVar18;
            uVar18 = (ulong)((int)uVar18 + 1);
          } while (bVar16);
        }
        plVar25 = (long *)*plVar25;
      } while (plVar25 != (long *)0x0);
    }
    pp_Var1 = &rawNewInfos.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
               ._M_h._M_single_bucket;
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket,(SubTypes *)pp_Var1);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagate
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,false,true);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagate
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,true,true);
    combinedInfos_00 = &scanner.functionCopyInfos;
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)combinedInfos_00,
                 &combinedSetInfos.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                  ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)combinedInfos_00);
    local_2b0 = this->refTest;
    local_3a8[0]._M_buckets = (__buckets_ptr)((ulong)local_3a8[0]._M_buckets & 0xffffffffffffff00);
    local_3a8[0]._M_bucket_count = 0;
    local_3a8[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2f0 = (void *)0x0;
    uStack_2e8 = 0;
    local_2e0 = 0;
    uStack_2d8 = 0;
    local_2d0 = 0;
    functionSetInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_01091b50;
    local_2b8 = &functionNewInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                 ._M_h._M_single_bucket;
    local_2af = 0;
    local_2c8 = combinedInfos_00;
    local_2c0 = pp_Var1;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
           *)&functionSetInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
              ._M_h._M_single_bucket,module);
    if (local_2f0 != (void *)0x0) {
      module = (Module *)(local_2e0 - (long)local_2f0);
      operator_delete(local_2f0,(ulong)module);
    }
    Pass::~Pass((Pass *)&functionSetInfos.
                         super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                         ._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&scanner.functionCopyInfos);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&propagator.subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      module = (Module *)
               ((long)propagator.subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      operator_delete(boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket,(ulong)module);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&boolPropagator.subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (subTypes.typeSubTypes._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      module = (Module *)
               ((long)boolPropagator.subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)subTypes.typeSubTypes._M_h._M_single_bucket);
      operator_delete(subTypes.typeSubTypes._M_h._M_single_bucket,(ulong)module);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&functionNewInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                      ._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
               *)combinedCopyInfos.
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                 ._M_h._M_bucket_count;
    if (rawNewInfos.
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
        ._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      module = (Module *)
               ((long)subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)rawNewInfos.
                     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                     ._M_h._M_single_bucket);
      operator_delete(rawNewInfos.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                      ._M_h._M_single_bucket,(ulong)module);
      this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
                 *)combinedCopyInfos.
                   super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                   ._M_h._M_bucket_count;
    }
    while (this_01 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
            *)0x0) {
      p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
                  **)this_01;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
      ::_M_deallocate_node(this_01,(__node_ptr)module);
      this_01 = p_Var14;
    }
    __n = (__node_ptr)0x0;
    memset(functionCopyInfos.
           super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
           ._M_h._M_single_bucket,0,
           (long)combinedCopyInfos.
                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                 ._M_h._M_buckets << 3);
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_bucket_count = 0;
    combinedCopyInfos.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((__node_base_ptr)
        &combinedCopyInfos.
         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
         ._M_h._M_rehash_policy._M_next_resize !=
        functionCopyInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
        ._M_h._M_single_bucket) {
      __n = (__node_ptr)
            ((long)combinedCopyInfos.
                   super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                   ._M_h._M_buckets << 3);
      operator_delete(functionCopyInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                      ._M_h._M_single_bucket,(ulong)__n);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&combinedSetInfos.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                      ._M_h._M_single_bucket);
    if (scanner.
        super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>.
        super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
        .
        super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        .
        super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      __n = (__node_ptr)
            ((long)scanner.
                   super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                   .
                   super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                   .
                   super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   .
                   super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   .stack.flexible.
                   super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)scanner.
                  super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                  .
                  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                  .
                  super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                  .
                  super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                  .stack.fixed._M_elems[9].currp);
      operator_delete(scanner.
                      super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                      .
                      super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                      .
                      super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                      .
                      super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                      .stack.fixed._M_elems[9].currp,(ulong)__n);
    }
    Pass::~Pass((Pass *)local_5b0);
    this_02 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>,_false>_>_>
               *)functionCopyInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                 ._M_h._M_bucket_count;
    while (this_02 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>,_false>_>_>
            *)0x0) {
      p_Var15 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>,_false>_>_>
                  **)this_02;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>,_false>_>_>
      ::_M_deallocate_node(this_02,__n);
      this_02 = p_Var15;
    }
    memset(combinedNewInfos.
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
           ._M_h._M_single_bucket,0,
           (long)functionCopyInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                 ._M_h._M_buckets << 3);
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_bucket_count = 0;
    functionCopyInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((__node_base_ptr)
        &functionCopyInfos.
         super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
         ._M_h._M_rehash_policy._M_next_resize !=
        combinedNewInfos.
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
        ._M_h._M_single_bucket) {
      operator_delete(combinedNewInfos.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                      ._M_h._M_single_bucket,
                      (long)functionCopyInfos.
                            super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>_>_>_>
                            ._M_h._M_buckets << 3);
    }
    std::
    _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&combinedInfos.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                      ._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_2a8);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // Find and analyze all writes inside each function.
    PCVFunctionStructValuesMap functionNewInfos(*module),
      functionSetInfos(*module);
    BoolFunctionStructValuesMap functionCopyInfos(*module);
    PCVScanner scanner(functionNewInfos, functionSetInfos, functionCopyInfos);
    auto* runner = getPassRunner();
    scanner.run(runner, module);
    scanner.runOnModuleCode(runner, module);

    // Combine the data from the functions.
    PCVStructValuesMap combinedNewInfos, combinedSetInfos;
    functionNewInfos.combineInto(combinedNewInfos);
    functionSetInfos.combineInto(combinedSetInfos);
    BoolStructValuesMap combinedCopyInfos;
    functionCopyInfos.combineInto(combinedCopyInfos);

    // Prepare data we will need later.
    SubTypes subTypes(*module);

    PCVStructValuesMap rawNewInfos;
    if (refTest) {
      // The refTest optimizations require the raw new infos (see above), but we
      // can skip copying here if we'll never read this.
      rawNewInfos = combinedNewInfos;
    }

    // Handle subtyping. |combinedInfo| so far contains data that represents
    // each struct.new and struct.set's operation on the struct type used in
    // that instruction. That is, if we do a struct.set to type T, the value was
    // noted for type T. But our actual goal is to answer questions about
    // struct.gets. Specifically, when later we see:
    //
    //  (struct.get $A x (REF-1))
    //
    // Then we want to be aware of all the relevant struct.sets, that is, the
    // sets that can write data that this get reads. Given a set
    //
    //  (struct.set $B x (REF-2) (..value..))
    //
    // then
    //
    //  1. If $B is a subtype of $A, it is relevant: the get might read from a
    //     struct of type $B (i.e., REF-1 and REF-2 might be identical, and both
    //     be a struct of type $B).
    //  2. If $B is a supertype of $A that still has the field x then it may
    //     also be relevant: since $A is a subtype of $B, the set may write to a
    //     struct of type $A (and again, REF-1 and REF-2 may be identical).
    //
    // Thus, if either $A <: $B or $B <: $A then we must consider the get and
    // set to be relevant to each other. To make our later lookups for gets
    // efficient, we therefore propagate information about the possible values
    // in each field to both subtypes and supertypes.
    //
    // struct.new on the other hand knows exactly what type is being written to,
    // and so given a get of $A and a new of $B, the new is relevant for the get
    // iff $A is a subtype of $B, so we only need to propagate in one direction
    // there, to supertypes.
    //
    // An exception to the above are copies. If a field is copied then even
    // struct.new information cannot be assumed to be precise:
    //
    //   // A :> B :> C
    //   ..
    //   new B(20);
    //   ..
    //   A1->f0 = A2->f0; // Either of these might refer to an A, B, or C.
    //   ..
    //   foo(A->f0);      // These can contain 20,
    //   foo(C->f0);      // if the copy read from B.
    //
    // To handle that, copied fields are treated like struct.set ones (by
    // copying the struct.new data to struct.set). Note that we must propagate
    // copying to subtypes first, as in the example above the struct.new values
    // of subtypes must be taken into account (that is, A or a subtype is being
    // copied, so we want to do the same thing for B and C as well as A, since
    // a copy of A means it could be a copy of B or C).
    StructUtils::TypeHierarchyPropagator<Bool> boolPropagator(subTypes);
    boolPropagator.propagateToSubTypes(combinedCopyInfos);
    for (auto& [type, copied] : combinedCopyInfos) {
      for (Index i = 0; i < copied.size(); i++) {
        if (copied[i]) {
          combinedSetInfos[type][i].combine(combinedNewInfos[type][i]);
        }
      }
    }

    StructUtils::TypeHierarchyPropagator<PossibleConstantValues> propagator(
      subTypes);
    propagator.propagateToSuperTypes(combinedNewInfos);
    propagator.propagateToSuperAndSubTypes(combinedSetInfos);

    // Combine both sources of information to the final information that gets
    // care about.
    PCVStructValuesMap combinedInfos = std::move(combinedNewInfos);
    combinedSetInfos.combineInto(combinedInfos);

    // Optimize.
    // TODO: Skip this if we cannot optimize anything
    FunctionOptimizer(combinedInfos, subTypes, rawNewInfos, refTest)
      .run(runner, module);
  }